

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcwidth.c
# Opt level: O3

int mk_wcswidth_cjk(uint *pwcs,size_t n)

{
  int iVar1;
  int iVar2;
  uint ucs;
  size_t sVar3;
  
  ucs = *pwcs;
  if (ucs == 0) {
    iVar2 = 0;
  }
  else {
    sVar3 = 0;
    iVar2 = 0;
    do {
      if (n == sVar3) {
        return iVar2;
      }
      iVar1 = mk_wcwidth_cjk(ucs);
      if (iVar1 < 0) {
        return -1;
      }
      iVar2 = iVar2 + iVar1;
      ucs = pwcs[sVar3 + 1];
      sVar3 = sVar3 + 1;
    } while (ucs != 0);
  }
  return iVar2;
}

Assistant:

int mk_wcswidth_cjk(const unsigned int *pwcs, size_t n)
{
  int w, width = 0;

  for (;*pwcs && n-- > 0; pwcs++)
    if ((w = mk_wcwidth_cjk(*pwcs)) < 0)
      return -1;
    else
      width += w;

  return width;
}